

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O2

bool basisu::unpack_bc1(void *pBlock_bits,color_rgba *pPixels,bool set_alpha)

{
  ushort uVar1;
  ushort uVar2;
  uint32_t uVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  uint32_t y;
  uint32_t uVar5;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_68;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  ushort local_50;
  ushort local_4e;
  undefined4 local_4c;
  uint32_t b1;
  uint32_t g1;
  uint32_t r1;
  uint32_t b0;
  uint32_t g0;
  uint32_t r0;
  
  local_4c = (undefined4)CONCAT71(in_register_00000011,set_alpha);
  uVar1 = *pBlock_bits;
  uVar2 = *(ushort *)((long)pBlock_bits + 2);
  local_50 = uVar2;
  local_4e = uVar1;
  bc1_block::unpack_color((uint)uVar1,&r0,&g0,&b0);
  bc1_block::unpack_color((uint)uVar2,&r1,&g1,&b1);
  local_68.m_comps[0] = (uint8_t)r0;
  local_68.m_comps[1] = (uint8_t)g0;
  local_68.m_comps[2] = (uint8_t)b0;
  local_59 = 0xff;
  local_68.m_comps[3] = 0xff;
  local_64 = (undefined1)r1;
  local_63 = (undefined1)g1;
  local_62 = (undefined1)b1;
  local_61 = 0xff;
  if (uVar2 < uVar1) {
    local_60 = (undefined1)((ulong)(r1 + r0 * 2) / 3);
    local_5f = (undefined1)((ulong)(g1 + g0 * 2) / 3);
    local_5e = (undefined1)((ulong)(b1 + b0 * 2) / 3);
    local_5c = (undefined1)((ulong)(r0 + r1 * 2) / 3);
    local_5b = (undefined1)((ulong)(g0 + g1 * 2) / 3);
    local_5a = (undefined1)((ulong)(b0 + b1 * 2) / 3);
  }
  else {
    local_5e = (undefined1)(b1 + b0 >> 1);
    local_60 = (undefined1)(r1 + r0 >> 1);
    local_5f = (undefined1)(g1 + g0 >> 1);
    local_5c = 0;
    local_5b = 0;
    local_5a = 0;
    local_59 = 0;
  }
  local_5d = 0xff;
  if ((char)local_4c == '\0') {
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      uVar3 = bc1_block::get_selector((bc1_block *)pBlock_bits,0,uVar5);
      uVar4 = (ulong)uVar3;
      (pPixels->field_0).m_comps[0] = local_68.m_comps[uVar4 * 4];
      (pPixels->field_0).m_comps[1] = local_68.m_comps[uVar4 * 4 + 1];
      (pPixels->field_0).m_comps[2] = local_68.m_comps[uVar4 * 4 + 2];
      uVar3 = bc1_block::get_selector((bc1_block *)pBlock_bits,1,uVar5);
      uVar4 = (ulong)uVar3;
      pPixels[1].field_0.m_comps[0] = local_68.m_comps[uVar4 * 4];
      pPixels[1].field_0.m_comps[1] = local_68.m_comps[uVar4 * 4 + 1];
      pPixels[1].field_0.m_comps[2] = local_68.m_comps[uVar4 * 4 + 2];
      uVar3 = bc1_block::get_selector((bc1_block *)pBlock_bits,2,uVar5);
      uVar4 = (ulong)uVar3;
      pPixels[2].field_0.m_comps[0] = local_68.m_comps[uVar4 * 4];
      pPixels[2].field_0.m_comps[1] = local_68.m_comps[uVar4 * 4 + 1];
      pPixels[2].field_0.m_comps[2] = local_68.m_comps[uVar4 * 4 + 2];
      uVar3 = bc1_block::get_selector((bc1_block *)pBlock_bits,3,uVar5);
      uVar4 = (ulong)uVar3;
      pPixels[3].field_0.m_comps[0] = local_68.m_comps[uVar4 * 4];
      pPixels[3].field_0.m_comps[1] = local_68.m_comps[uVar4 * 4 + 1];
      pPixels[3].field_0.m_comps[2] = local_68.m_comps[uVar4 * 4 + 2];
      pPixels = pPixels + 4;
    }
  }
  else {
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      uVar3 = bc1_block::get_selector((bc1_block *)pBlock_bits,0,uVar5);
      *pPixels = (color_rgba)(&local_68)[uVar3];
      uVar3 = bc1_block::get_selector((bc1_block *)pBlock_bits,1,uVar5);
      (&pPixels->field_0)[1] = (&local_68)[uVar3];
      uVar3 = bc1_block::get_selector((bc1_block *)pBlock_bits,2,uVar5);
      (&pPixels->field_0)[2] = (&local_68)[uVar3];
      uVar3 = bc1_block::get_selector((bc1_block *)pBlock_bits,3,uVar5);
      (&pPixels->field_0)[3] = (&local_68)[uVar3];
      pPixels = (color_rgba *)(&pPixels->field_0 + 4);
    }
  }
  return local_4e <= local_50;
}

Assistant:

bool unpack_bc1(const void *pBlock_bits, color_rgba *pPixels, bool set_alpha)
	{
		static_assert(sizeof(bc1_block) == 8, "sizeof(bc1_block) == 8");

		const bc1_block *pBlock = static_cast<const bc1_block *>(pBlock_bits);

		const uint32_t l = pBlock->get_low_color();
		const uint32_t h = pBlock->get_high_color();

		color_rgba c[4];

		uint32_t r0, g0, b0, r1, g1, b1;
		bc1_block::unpack_color(l, r0, g0, b0);
		bc1_block::unpack_color(h, r1, g1, b1);

		c[0].set_noclamp_rgba(r0, g0, b0, 255);
		c[1].set_noclamp_rgba(r1, g1, b1, 255);

		bool used_punchthrough = false;

		if (l > h)
		{
			c[2].set_noclamp_rgba((r0 * 2 + r1) / 3, (g0 * 2 + g1) / 3, (b0 * 2 + b1) / 3, 255);
			c[3].set_noclamp_rgba((r1 * 2 + r0) / 3, (g1 * 2 + g0) / 3, (b1 * 2 + b0) / 3, 255);
		}
		else
		{
			c[2].set_noclamp_rgba((r0 + r1) / 2, (g0 + g1) / 2, (b0 + b1) / 2, 255);
			c[3].set_noclamp_rgba(0, 0, 0, 0);
			used_punchthrough = true;
		}

		if (set_alpha)
		{
			for (uint32_t y = 0; y < 4; y++, pPixels += 4)
			{
				pPixels[0] = c[pBlock->get_selector(0, y)]; 
				pPixels[1] = c[pBlock->get_selector(1, y)]; 
				pPixels[2] = c[pBlock->get_selector(2, y)]; 
				pPixels[3] = c[pBlock->get_selector(3, y)];
			}
		}
		else
		{
			for (uint32_t y = 0; y < 4; y++, pPixels += 4)
			{
				pPixels[0].set_rgb(c[pBlock->get_selector(0, y)]); 
				pPixels[1].set_rgb(c[pBlock->get_selector(1, y)]); 
				pPixels[2].set_rgb(c[pBlock->get_selector(2, y)]); 
				pPixels[3].set_rgb(c[pBlock->get_selector(3, y)]);
			}
		}

		return used_punchthrough;
	}